

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

void __thiscall QIconTheme::QIconTheme(QIconTheme *this,QString *themeName)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  const_reference pQVar5;
  ulong uVar6;
  const_iterator o;
  QStringBuilder<QString,_char16_t> *c;
  QList<QString> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar7;
  int size;
  QString *key;
  QStringList *__range2;
  int i;
  QString context;
  QString type;
  QString directoryKey;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList keys;
  QSettings indexReader;
  QFileInfo themeDirInfo;
  QString themeDir;
  QDir iconDir;
  QStringList iconDirs;
  QFile themeIndex;
  QIconDirInfo dirInfo;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  QIconDirInfo *in_stack_fffffffffffff960;
  QStringBuilder<QString,_char16_t> *in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff970;
  int in_stack_fffffffffffff974;
  QStringBuilder<QString,_char16_t> *in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff9a0 [16];
  int local_624;
  const_iterator local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 local_330 [24];
  anon_union_24_3_e3d07ef4_for_data local_318 [3];
  QDebug local_2d0;
  QLatin1StringView local_2c8;
  undefined1 *local_278;
  undefined2 local_26a;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  QList<QString> local_230;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 local_208 [24];
  undefined2 local_1f0;
  undefined2 local_1ee;
  undefined2 local_1ec;
  undefined2 local_1ea;
  undefined2 local_1e8;
  undefined1 local_1e6;
  Context local_1e5;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  QVariant local_188;
  QVariant local_168;
  QVariant local_148;
  QVariant local_128;
  QVariant local_108;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QString>::QList((QList<QString> *)0x29ec4e);
  QList<QIconDirInfo>::QList((QList<QIconDirInfo> *)0x29ec5c);
  QList<QString>::QList((QList<QString> *)0x29ec6a);
  *(undefined1 *)(in_RDI + 0x48) = 0;
  QList<QSharedPointer<QIconCacheGtkReader>_>::QList
            ((QList<QSharedPointer<QIconCacheGtkReader>_> *)0x29ec7c);
  local_218 = &DAT_aaaaaaaaaaaaaaaa;
  local_210 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_218);
  local_230.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_230.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_230.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::themeSearchPaths();
  for (local_624 = 0; qVar4 = QList<QString>::size(&local_230), local_624 < qVar4;
      local_624 = local_624 + 1) {
    local_238 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = QList<QString>::operator[]
                       ((QList<QString> *)in_stack_fffffffffffff960,
                        CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    QDir::QDir((QDir *)&local_238,(QString *)pQVar5);
    local_250 = &DAT_aaaaaaaaaaaaaaaa;
    local_248 = &DAT_aaaaaaaaaaaaaaaa;
    local_240 = &DAT_aaaaaaaaaaaaaaaa;
    QDir::path();
    local_26a = 0x2f;
    ::operator+(&in_stack_fffffffffffff968->a,(char16_t *)in_stack_fffffffffffff960);
    ::operator+(in_stack_fffffffffffff968,&in_stack_fffffffffffff960->path);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&> *)0x29edf3);
    QStringBuilder<QString,_char16_t>::~QStringBuilder
              ((QStringBuilder<QString,_char16_t> *)0x29ee00);
    QString::~QString((QString *)0x29ee0d);
    local_278 = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_278,(QString *)&local_250);
    uVar6 = QFileInfo::isDir();
    if ((uVar6 & 1) != 0) {
      QList<QString>::operator<<
                ((QList<QString> *)in_stack_fffffffffffff960,
                 (parameter_type)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      QSharedPointer<QIconCacheGtkReader>::create<QString&>((QString *)(in_RDI + 0x50));
      QList<QSharedPointer<QIconCacheGtkReader>_>::operator<<
                ((QList<QSharedPointer<QIconCacheGtkReader>_> *)in_stack_fffffffffffff960,
                 (rvalue_ref)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      QSharedPointer<QIconCacheGtkReader>::~QSharedPointer
                ((QSharedPointer<QIconCacheGtkReader> *)0x29ee98);
    }
    if ((*(byte *)(in_RDI + 0x48) & 1) == 0) {
      local_2c8 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffff968,(size_t)in_stack_fffffffffffff960);
      ::operator+(&in_stack_fffffffffffff960->path,
                  (QLatin1String *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString_&,_QLatin1String> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      QFile::setFileName((QString *)&local_218);
      QString::~QString((QString *)0x29ef1c);
      bVar1 = QFile::exists();
      *(byte *)(in_RDI + 0x48) = bVar1 & 1;
      local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
      local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
      lcIconLoader();
      anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffff960,
                 (QLoggingCategory *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_1e0), bVar2) {
        anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x29ef8c);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                   (char *)in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
                   (char *)0x29efa5);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffff978,in_stack_fffffffffffff9a0._8_8_);
        QFile::fileName();
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                           &in_stack_fffffffffffff968->a);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffff960,(bool)in_stack_fffffffffffff95f);
        QString::~QString((QString *)0x29f01c);
        QDebug::~QDebug(&local_2d0);
        local_1d8 = (undefined1 *)((ulong)local_1d8 & 0xffffffffffffff00);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_278);
    QString::~QString((QString *)0x29f052);
    QDir::~QDir((QDir *)&local_238);
  }
  if ((*(byte *)(in_RDI + 0x48) & 1) != 0) {
    local_318[0].shared = &DAT_aaaaaaaaaaaaaaaa;
    local_318[0]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFile::fileName();
    QSettings::QSettings
              ((QSettings *)local_318[0].data,(QString *)local_330,IniFormat,(QObject *)0x0);
    QString::~QString((QString *)0x29f0e2);
    local_348 = &DAT_aaaaaaaaaaaaaaaa;
    local_340 = &DAT_aaaaaaaaaaaaaaaa;
    local_338 = &DAT_aaaaaaaaaaaaaaaa;
    QSettings::allKeys();
    local_350.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_350 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffff960);
    o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffff960);
    while (bVar2 = QList<QString>::const_iterator::operator!=(&local_350,o), bVar2) {
      c = (QStringBuilder<QString,_char16_t> *)QList<QString>::const_iterator::operator*(&local_350)
      ;
      in_stack_fffffffffffff978 = c;
      QVar7 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff968,(size_t)in_stack_fffffffffffff960);
      uVar6 = QString::endsWith((QLatin1String *)in_stack_fffffffffffff978,
                                (CaseSensitivity)QVar7.m_size);
      if ((uVar6 & 1) != 0) {
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                   &in_stack_fffffffffffff968->a);
        QSettings::value((QAnyStringView *)&local_28);
        iVar3 = ::QVariant::toInt((bool *)&local_28);
        ::QVariant::~QVariant(&local_28);
        in_stack_fffffffffffff974 = iVar3;
        if (iVar3 != 0) {
          QString::size((QString *)c);
          QString::left(&in_stack_fffffffffffff978->a,
                        CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
          memset(local_208,0xaa,0x28);
          QIconDirInfo::QIconDirInfo
                    (in_stack_fffffffffffff960,
                     (QString *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
          local_1f0 = (undefined2)iVar3;
          Qt::Literals::StringLiterals::operator____L1((char *)c,(size_t)in_stack_fffffffffffff960);
          ::operator+(&in_stack_fffffffffffff960->path,
                      (QLatin1String *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)
                     );
          QString::QString((QString *)0x29f38e);
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                     ,(QStringBuilder<QString_&,_QLatin1String> *)c,&in_stack_fffffffffffff960->path
                    );
          QSettings::value((QAnyStringView *)&local_48);
          ::QVariant::toString();
          ::QVariant::~QVariant(&local_48);
          QString::~QString((QString *)0x29f3ff);
          Qt::Literals::StringLiterals::operator____L1((char *)c,(size_t)in_stack_fffffffffffff960);
          bVar2 = ::operator==(&c->a,(QLatin1StringView *)in_stack_fffffffffffff960);
          if (bVar2) {
            local_1e6 = 0;
          }
          else {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)c,(size_t)in_stack_fffffffffffff960);
            bVar2 = ::operator==(&c->a,(QLatin1StringView *)in_stack_fffffffffffff960);
            if (bVar2) {
              local_1e6 = 1;
            }
            else {
              local_1e6 = 2;
            }
          }
          Qt::Literals::StringLiterals::operator____L1((char *)c,(size_t)in_stack_fffffffffffff960);
          ::operator+(&in_stack_fffffffffffff960->path,
                      (QLatin1String *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)
                     );
          QString::QString((QString *)0x29f4e0);
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                     ,(QStringBuilder<QString_&,_QLatin1String> *)c,&in_stack_fffffffffffff960->path
                    );
          ::QVariant::QVariant(&local_88,2);
          QSettings::value((QAnyStringView *)&local_68,(QVariant *)local_318);
          local_1ea = ::QVariant::toInt((bool *)&local_68);
          ::QVariant::~QVariant(&local_68);
          ::QVariant::~QVariant(&local_88);
          QString::~QString((QString *)0x29f57c);
          Qt::Literals::StringLiterals::operator____L1((char *)c,(size_t)in_stack_fffffffffffff960);
          ::operator+(&in_stack_fffffffffffff960->path,
                      (QLatin1String *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)
                     );
          QString::QString((QString *)0x29f5c7);
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                     ,(QStringBuilder<QString_&,_QLatin1String> *)c,&in_stack_fffffffffffff960->path
                    );
          ::QVariant::QVariant(&local_c8,iVar3);
          QSettings::value((QAnyStringView *)&local_a8,(QVariant *)local_318);
          local_1ec = ::QVariant::toInt((bool *)&local_a8);
          ::QVariant::~QVariant(&local_a8);
          ::QVariant::~QVariant(&local_c8);
          QString::~QString((QString *)0x29f662);
          Qt::Literals::StringLiterals::operator____L1((char *)c,(size_t)in_stack_fffffffffffff960);
          ::operator+(&in_stack_fffffffffffff960->path,
                      (QLatin1String *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)
                     );
          QString::QString((QString *)0x29f6ad);
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                     ,(QStringBuilder<QString_&,_QLatin1String> *)c,&in_stack_fffffffffffff960->path
                    );
          ::QVariant::QVariant(&local_108,iVar3);
          QSettings::value((QAnyStringView *)&local_e8,(QVariant *)local_318);
          local_1ee = ::QVariant::toInt((bool *)&local_e8);
          ::QVariant::~QVariant(&local_e8);
          ::QVariant::~QVariant(&local_108);
          QString::~QString((QString *)0x29f748);
          Qt::Literals::StringLiterals::operator____L1((char *)c,(size_t)in_stack_fffffffffffff960);
          ::operator+(&in_stack_fffffffffffff960->path,
                      (QLatin1String *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)
                     );
          QString::QString((QString *)0x29f793);
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                     ,(QStringBuilder<QString_&,_QLatin1String> *)c,&in_stack_fffffffffffff960->path
                    );
          ::QVariant::QVariant(&local_148,1);
          QSettings::value((QAnyStringView *)&local_128,(QVariant *)local_318);
          local_1e8 = ::QVariant::toInt((bool *)&local_128);
          ::QVariant::~QVariant(&local_128);
          ::QVariant::~QVariant(&local_148);
          QString::~QString((QString *)0x29f82f);
          Qt::Literals::StringLiterals::operator____L1((char *)c,(size_t)in_stack_fffffffffffff960);
          ::operator+(&in_stack_fffffffffffff960->path,
                      (QLatin1String *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)
                     );
          QString::QString((QString *)0x29f8a7);
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                     ,(QStringBuilder<QString_&,_QLatin1String> *)c,&in_stack_fffffffffffff960->path
                    );
          QSettings::value((QAnyStringView *)&local_168);
          ::QVariant::toString();
          ::QVariant::~QVariant(&local_168);
          QString::~QString((QString *)0x29f918);
          QString::QString(&in_stack_fffffffffffff960->path,
                           (QString *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958))
          ;
          local_1e5 = QIconTheme::anon_class_24_1_bc11688f::operator()
                                ((anon_class_24_1_bc11688f *)in_stack_fffffffffffff960);
          QIconTheme(QString_const&)::$_0::~__0((anon_class_24_1_bc11688f *)0x29f94e);
          QList<QIconDirInfo>::append
                    ((QList<QIconDirInfo> *)in_stack_fffffffffffff960,
                     (parameter_type)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
          QString::~QString((QString *)0x29f971);
          QString::~QString((QString *)0x29f97e);
          QIconDirInfo::~QIconDirInfo((QIconDirInfo *)0x29f98b);
          QString::~QString((QString *)0x29f998);
          in_stack_fffffffffffff968 = c;
        }
      }
      QList<QString>::const_iterator::operator++(&local_350);
    }
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff968,(size_t)in_stack_fffffffffffff960);
    QVar7.m_size._4_4_ = in_stack_fffffffffffff974;
    QVar7.m_size._0_4_ = in_stack_fffffffffffff970;
    QVar7.m_data = (char *)in_stack_fffffffffffff978;
    QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffff968,QVar7);
    QSettings::value((QAnyStringView *)&local_188);
    ::QVariant::toStringList();
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffff960,
               (QList<QString> *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    QList<QString>::~QList((QList<QString> *)0x29fa3d);
    ::QVariant::~QVariant(&local_188);
    this_00 = (QList<QString> *)(in_RDI + 0x30);
    QString::QString((QString *)0x29fa65);
    QList<QString>::removeAll<QString>
              (this_00,(QString *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    QString::~QString((QString *)0x29fa84);
    QList<QString>::~QList((QList<QString> *)0x29fa91);
    QSettings::~QSettings((QSettings *)local_318[0].data);
  }
  QList<QString>::~QList((QList<QString> *)0x29faab);
  QFile::~QFile((QFile *)&local_218);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QIconTheme::QIconTheme(const QString &themeName)
        : m_valid(false)
{
    QFile themeIndex;

    const QStringList iconDirs = QIcon::themeSearchPaths();
    for ( int i = 0 ; i < iconDirs.size() ; ++i) {
        QDir iconDir(iconDirs[i]);
        QString themeDir = iconDir.path() + u'/' + themeName;
        QFileInfo themeDirInfo(themeDir);

        if (themeDirInfo.isDir()) {
            m_contentDirs << themeDir;
            m_gtkCaches << QSharedPointer<QIconCacheGtkReader>::create(themeDir);
        }

        if (!m_valid) {
            themeIndex.setFileName(themeDir + "/index.theme"_L1);
            m_valid = themeIndex.exists();
            qCDebug(lcIconLoader) << "Probing theme file at" << themeIndex.fileName() << m_valid;
        }
    }
#if QT_CONFIG(settings)
    if (m_valid) {
        const QSettings indexReader(themeIndex.fileName(), QSettings::IniFormat);
        const QStringList keys = indexReader.allKeys();
        for (const QString &key : keys) {
            if (key.endsWith("/Size"_L1)) {
                // Note the QSettings ini-format does not accept
                // slashes in key names, hence we have to cheat
                if (int size = indexReader.value(key).toInt()) {
                    QString directoryKey = key.left(key.size() - 5);
                    QIconDirInfo dirInfo(directoryKey);
                    dirInfo.size = size;
                    QString type = indexReader.value(directoryKey + "/Type"_L1).toString();

                    if (type == "Fixed"_L1)
                        dirInfo.type = QIconDirInfo::Fixed;
                    else if (type == "Scalable"_L1)
                        dirInfo.type = QIconDirInfo::Scalable;
                    else
                        dirInfo.type = QIconDirInfo::Threshold;

                    dirInfo.threshold = indexReader.value(directoryKey +
                                                          "/Threshold"_L1,
                                                          2).toInt();

                    dirInfo.minSize = indexReader.value(directoryKey + "/MinSize"_L1, size).toInt();

                    dirInfo.maxSize = indexReader.value(directoryKey + "/MaxSize"_L1, size).toInt();

                    dirInfo.scale = indexReader.value(directoryKey + "/Scale"_L1, 1).toInt();

                    const QString context = indexReader.value(directoryKey + "/Context"_L1).toString();
                    dirInfo.context = [context]() {
                        if (context == "Applications"_L1)
                            return QIconDirInfo::Applications;
                        else if (context == "MimeTypes"_L1)
                            return QIconDirInfo::MimeTypes;
                        else
                            return QIconDirInfo::UnknownContext;
                    }();

                    m_keyList.append(dirInfo);
                }
            }
        }

        // Parent themes provide fallbacks for missing icons
        m_parents = indexReader.value("Icon Theme/Inherits"_L1).toStringList();
        m_parents.removeAll(QString());
    }
#endif // settings
}